

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O2

void __thiscall
flatbuffers::go::GoGenerator::GenNativeTableUnPack
          (GoGenerator *this,StructDef *struct_def,string *code_ptr)

{
  IdlNamer *pIVar1;
  BaseType BVar2;
  FieldDef *__lhs;
  EnumDef *pEVar3;
  StructDef *def;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  pointer ppFVar4;
  string field_table;
  string field_field;
  string length;
  string field_var;
  string struct_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  StructDef *local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  IdlNamer *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  GoGenerator *local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pIVar1 = &this->namer_;
  local_168 = struct_def;
  local_118 = this;
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_90,pIVar1);
  std::operator+(&local_1c8,"func (rcv *",&local_90);
  std::operator+(&local_138,&local_1c8,") UnPackTo(t *");
  (*(pIVar1->super_Namer)._vptr_Namer[0x11])(&local_1e8,pIVar1,local_168);
  std::operator+(&local_110,&local_138,&local_1e8);
  std::operator+(&local_188,&local_110,") {\n");
  local_140 = pIVar1;
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_1c8);
  ppFVar4 = (local_168->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    pIVar1 = local_140;
    if (ppFVar4 ==
        (local_168->fields).vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::append((char *)code_ptr);
      pIVar1 = local_140;
      std::operator+(&local_1c8,"func (rcv *",&local_90);
      std::operator+(&local_138,&local_1c8,") UnPack() *");
      (*(pIVar1->super_Namer)._vptr_Namer[0x11])(&local_1e8,pIVar1,local_168);
      std::operator+(&local_110,&local_138,&local_1e8);
      std::operator+(&local_188,&local_110," {\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::append((char *)code_ptr);
      (*(pIVar1->super_Namer)._vptr_Namer[0x11])(&local_138,pIVar1,local_168);
      std::operator+(&local_110,"\tt := &",&local_138);
      std::operator+(&local_188,&local_110,"{}\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::append((char *)code_ptr);
      std::__cxx11::string::append((char *)code_ptr);
      std::__cxx11::string::append((char *)code_ptr);
      std::__cxx11::string::~string((string *)&local_90);
      return;
    }
    __lhs = *ppFVar4;
    if (__lhs->deprecated == false) {
      (*(local_140->super_Namer)._vptr_Namer[0x12])(&local_188,local_140,__lhs);
      (*(pIVar1->super_Namer)._vptr_Namer[7])(&local_110,pIVar1,__lhs);
      std::operator+(&local_138,&local_110,"Length");
      BVar2 = (__lhs->value).type.base_type;
      if (BVar2 - BASE_TYPE_UTYPE < 0xc) {
        pEVar3 = (__lhs->value).type.enum_def;
        if ((pEVar3 == (EnumDef *)0x0) || (pEVar3->is_union == false)) {
          std::operator+(&local_160,"\tt.",&local_188);
          std::operator+(&local_1a8,&local_160," = rcv.");
          std::operator+(&local_1e8,&local_1a8,&local_188);
          std::operator+(&local_1c8,&local_1e8,"()\n");
          std::__cxx11::string::append((string *)code_ptr);
          goto LAB_001ab0c1;
        }
      }
      else {
        switch(BVar2) {
        case BASE_TYPE_STRING:
          std::operator+(&local_160,"\tt.",&local_188);
          std::operator+(&local_1a8,&local_160," = string(rcv.");
          std::operator+(&local_1e8,&local_1a8,&local_188);
          std::operator+(&local_1c8,&local_1e8,"())\n");
          std::__cxx11::string::append((string *)code_ptr);
          break;
        case BASE_TYPE_VECTOR:
        case BASE_TYPE_VECTOR64:
          if (((__lhs->value).type.element != BASE_TYPE_UCHAR) ||
             ((__lhs->value).type.enum_def != (EnumDef *)0x0)) {
            std::operator+(&local_160,"\t",&local_138);
            std::operator+(&local_1a8,&local_160," := rcv.");
            std::operator+(&local_1e8,&local_1a8,&local_188);
            std::operator+(&local_1c8,&local_1e8,"Length()\n");
            std::__cxx11::string::append((string *)code_ptr);
            std::__cxx11::string::~string((string *)&local_1c8);
            std::__cxx11::string::~string((string *)&local_1e8);
            std::__cxx11::string::~string((string *)&local_1a8);
            std::__cxx11::string::~string((string *)&local_160);
            std::operator+(&local_b0,"\tt.",&local_188);
            std::operator+(&local_f0,&local_b0," = make(");
            NativeType_abi_cxx11_(&local_d0,local_118,&(__lhs->value).type);
            std::operator+(&local_160,&local_f0,&local_d0);
            std::operator+(&local_1a8,&local_160,", ");
            std::operator+(&local_1e8,&local_1a8,&local_138);
            std::operator+(&local_1c8,&local_1e8,")\n");
            std::__cxx11::string::append((string *)code_ptr);
            std::__cxx11::string::~string((string *)&local_1c8);
            std::__cxx11::string::~string((string *)&local_1e8);
            std::__cxx11::string::~string((string *)&local_1a8);
            std::__cxx11::string::~string((string *)&local_160);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::~string((string *)&local_f0);
            std::__cxx11::string::~string((string *)&local_b0);
            std::operator+(&local_1e8,"\tfor j := 0; j < ",&local_138);
            std::operator+(&local_1c8,&local_1e8,"; j++ {\n");
            std::__cxx11::string::append((string *)code_ptr);
            std::__cxx11::string::~string((string *)&local_1c8);
            std::__cxx11::string::~string((string *)&local_1e8);
            if ((__lhs->value).type.element == BASE_TYPE_STRUCT) {
              def = (__lhs->value).type.struct_def;
              WrapInNameSpaceAndTrack(&local_1a8,local_118,&def->super_Definition,(string *)def);
              std::operator+(&local_1e8,"\t\tx := ",&local_1a8);
              std::operator+(&local_1c8,&local_1e8,"{}\n");
              std::__cxx11::string::append((string *)code_ptr);
              std::__cxx11::string::~string((string *)&local_1c8);
              std::__cxx11::string::~string((string *)&local_1e8);
              std::__cxx11::string::~string((string *)&local_1a8);
              std::operator+(&local_1e8,"\t\trcv.",&local_188);
              std::operator+(&local_1c8,&local_1e8,"(&x, j)\n");
              std::__cxx11::string::append((string *)code_ptr);
              std::__cxx11::string::~string((string *)&local_1c8);
              std::__cxx11::string::~string((string *)&local_1e8);
            }
            std::operator+(&local_1e8,"\t\tt.",&local_188);
            std::operator+(&local_1c8,&local_1e8,"[j] = ");
            std::__cxx11::string::append((string *)code_ptr);
            std::__cxx11::string::~string((string *)&local_1c8);
            std::__cxx11::string::~string((string *)&local_1e8);
            BVar2 = (__lhs->value).type.element;
            if (BVar2 - BASE_TYPE_UTYPE < 0xc) {
              std::operator+(&local_1e8,"rcv.",&local_188);
              std::operator+(&local_1c8,&local_1e8,"(j)");
              std::__cxx11::string::append((string *)code_ptr);
LAB_001ab009:
              std::__cxx11::string::~string((string *)&local_1c8);
              std::__cxx11::string::~string((string *)&local_1e8);
            }
            else {
              if (BVar2 != BASE_TYPE_STRUCT) {
                if (BVar2 != BASE_TYPE_STRING) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_go.cpp"
                                ,0x4f0,
                                "void flatbuffers::go::GoGenerator::GenNativeTableUnPack(const StructDef &, std::string *)"
                               );
                }
                std::operator+(&local_1e8,"string(rcv.",&local_188);
                std::operator+(&local_1c8,&local_1e8,"(j))");
                std::__cxx11::string::append((string *)code_ptr);
                goto LAB_001ab009;
              }
              std::__cxx11::string::append((char *)code_ptr);
            }
            std::__cxx11::string::append((char *)code_ptr);
            std::__cxx11::string::append((char *)code_ptr);
            goto LAB_001ab0ea;
          }
          std::operator+(&local_160,"\tt.",&local_188);
          std::operator+(&local_1a8,&local_160," = rcv.");
          std::operator+(&local_1e8,&local_1a8,&local_188);
          std::operator+(&local_1c8,&local_1e8,"Bytes()\n");
          std::__cxx11::string::append((string *)code_ptr);
          break;
        case BASE_TYPE_STRUCT:
          std::operator+(&local_160,"\tt.",&local_188);
          std::operator+(&local_1a8,&local_160," = rcv.");
          std::operator+(&local_1e8,&local_1a8,&local_188);
          std::operator+(&local_1c8,&local_1e8,"(nil).UnPack()\n");
          std::__cxx11::string::append((string *)code_ptr);
          break;
        case BASE_TYPE_UNION:
          std::operator+(&local_1c8,&local_110,"Table");
          std::operator+(&local_1a8,"\t",&local_1c8);
          std::operator+(&local_1e8,&local_1a8," := flatbuffers.Table{}\n");
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::__cxx11::string::~string((string *)&local_1a8);
          (*(local_140->super_Namer)._vptr_Namer[4])(&local_b0,local_140,__lhs);
          std::operator+(&local_f0,"\tif rcv.",&local_b0);
          std::operator+(&local_160,&local_f0,"(&");
          std::operator+(&local_1a8,&local_160,&local_1c8);
          std::operator+(&local_1e8,&local_1a8,") {\n");
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::__cxx11::string::~string((string *)&local_1a8);
          std::__cxx11::string::~string((string *)&local_160);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_b0);
          std::operator+(&local_d0,"\t\tt.",&local_188);
          std::operator+(&local_b0,&local_d0," = rcv.");
          std::operator+(&local_70,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                         "_type");
          (*(local_118->namer_).super_Namer._vptr_Namer[0x14])
                    (&local_50,local_140,&local_70,
                     (ulong)(local_118->namer_).super_Namer.config_.methods);
          std::operator+(&local_f0,&local_b0,&local_50);
          std::operator+(&local_160,&local_f0,"().UnPack(");
          std::operator+(&local_1a8,&local_160,&local_1c8);
          std::operator+(&local_1e8,&local_1a8,")\n");
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::__cxx11::string::~string((string *)&local_1a8);
          std::__cxx11::string::~string((string *)&local_160);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::append((char *)code_ptr);
          this_00 = &local_1c8;
          goto LAB_001ab0e5;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_go.cpp"
                        ,0x501,
                        "void flatbuffers::go::GoGenerator::GenNativeTableUnPack(const StructDef &, std::string *)"
                       );
        }
LAB_001ab0c1:
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_1a8);
        this_00 = &local_160;
LAB_001ab0e5:
        std::__cxx11::string::~string((string *)this_00);
      }
LAB_001ab0ea:
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_188);
    }
    ppFVar4 = ppFVar4 + 1;
  } while( true );
}

Assistant:

void GenNativeTableUnPack(const StructDef &struct_def,
                            std::string *code_ptr) {
    std::string &code = *code_ptr;
    const std::string struct_type = namer_.Type(struct_def);

    code += "func (rcv *" + struct_type + ") UnPackTo(t *" +
            NativeName(struct_def) + ") {\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const FieldDef &field = **it;
      if (field.deprecated) continue;
      const std::string field_field = namer_.Field(field);
      const std::string field_var = namer_.Variable(field);
      const std::string length = field_var + "Length";
      if (IsScalar(field.value.type.base_type)) {
        if (field.value.type.enum_def != nullptr &&
            field.value.type.enum_def->is_union)
          continue;
        code += "\tt." + field_field + " = rcv." + field_field + "()\n";
      } else if (IsString(field.value.type)) {
        code += "\tt." + field_field + " = string(rcv." + field_field + "())\n";
      } else if (IsVector(field.value.type) &&
                 field.value.type.element == BASE_TYPE_UCHAR &&
                 field.value.type.enum_def == nullptr) {
        code += "\tt." + field_field + " = rcv." + field_field + "Bytes()\n";
      } else if (IsVector(field.value.type)) {
        code += "\t" + length + " := rcv." + field_field + "Length()\n";
        code += "\tt." + field_field + " = make(" +
                NativeType(field.value.type) + ", " + length + ")\n";
        code += "\tfor j := 0; j < " + length + "; j++ {\n";
        if (field.value.type.element == BASE_TYPE_STRUCT) {
          code += "\t\tx := " +
                  WrapInNameSpaceAndTrack(field.value.type.struct_def,
                                          field.value.type.struct_def->name) +
                  "{}\n";
          code += "\t\trcv." + field_field + "(&x, j)\n";
        }
        code += "\t\tt." + field_field + "[j] = ";
        if (IsScalar(field.value.type.element)) {
          code += "rcv." + field_field + "(j)";
        } else if (field.value.type.element == BASE_TYPE_STRING) {
          code += "string(rcv." + field_field + "(j))";
        } else if (field.value.type.element == BASE_TYPE_STRUCT) {
          code += "x.UnPack()";
        } else {
          // TODO(iceboy): Support vector of unions.
          FLATBUFFERS_ASSERT(0);
        }
        code += "\n";
        code += "\t}\n";
      } else if (field.value.type.base_type == BASE_TYPE_STRUCT) {
        code +=
            "\tt." + field_field + " = rcv." + field_field + "(nil).UnPack()\n";
      } else if (field.value.type.base_type == BASE_TYPE_UNION) {
        const std::string field_table = field_var + "Table";
        code += "\t" + field_table + " := flatbuffers.Table{}\n";
        code +=
            "\tif rcv." + namer_.Method(field) + "(&" + field_table + ") {\n";
        code += "\t\tt." + field_field + " = rcv." +
                namer_.Method(field.name + UnionTypeFieldSuffix()) +
                "().UnPack(" + field_table + ")\n";
        code += "\t}\n";
      } else {
        FLATBUFFERS_ASSERT(0);
      }
    }
    code += "}\n\n";

    code += "func (rcv *" + struct_type + ") UnPack() *" +
            NativeName(struct_def) + " {\n";
    code += "\tif rcv == nil {\n\t\treturn nil\n\t}\n";
    code += "\tt := &" + NativeName(struct_def) + "{}\n";
    code += "\trcv.UnPackTo(t)\n";
    code += "\treturn t\n";
    code += "}\n\n";
  }